

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O3

void __thiscall github111116::ConsoleLogger::debug<char[35]>(ConsoleLogger *this,char (*args) [35])

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
  if (iVar1 == 0) {
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,(this->debugColor)._M_dataplus._M_p,(this->debugColor)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->out,"... ",4);
    print<char[35]>(this,args);
    if (this->colored == true) {
      std::__ostream_insert<char,std::char_traits<char>>(this->out,"\x1b[0m",4);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void ConsoleLogger::debug(const Args&... args)
{
#ifndef NDEBUG
	mtx.lock();
	if (colored) out << debugColor;
	out << "... ";
	print(args...);
	if (colored) out << "\033[0m";
	mtx.unlock();
#endif
}